

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O2

FT_Error ft_outline_glyph_init(FT_Glyph outline_glyph,FT_GlyphSlot slot)

{
  FT_Error FVar1;
  FT_OutlineGlyph glyph;
  
  if (slot->format == FT_GLYPH_FORMAT_OUTLINE) {
    FVar1 = FT_Outline_New(outline_glyph->library,(int)(slot->outline).n_points,
                           (int)(slot->outline).n_contours,(FT_Outline *)(outline_glyph + 1));
    if (FVar1 == 0) {
      FT_Outline_Copy(&slot->outline,(FT_Outline *)(outline_glyph + 1));
      FVar1 = 0;
    }
    return FVar1;
  }
  return 0x12;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  ft_outline_glyph_init( FT_Glyph      outline_glyph,
                         FT_GlyphSlot  slot )
  {
    FT_OutlineGlyph  glyph   = (FT_OutlineGlyph)outline_glyph;
    FT_Error         error   = FT_Err_Ok;
    FT_Library       library = FT_GLYPH( glyph )->library;
    FT_Outline*      source  = &slot->outline;
    FT_Outline*      target  = &glyph->outline;


    /* check format in glyph slot */
    if ( slot->format != FT_GLYPH_FORMAT_OUTLINE )
    {
      error = FT_THROW( Invalid_Glyph_Format );
      goto Exit;
    }

    /* allocate new outline */
    error = FT_Outline_New( library,
                            (FT_UInt)source->n_points,
                            source->n_contours,
                            &glyph->outline );
    if ( error )
      goto Exit;

    FT_Outline_Copy( source, target );

  Exit:
    return error;
  }